

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreachable.cc
# Opt level: O0

void __thiscall re2c::Node::calc_reachable(Node *this)

{
  bool bVar1;
  pointer ppVar2;
  iterator __first;
  iterator __last;
  _Self local_38;
  _Self local_30;
  iterator i;
  local_inc _;
  Node *this_local;
  
  bVar1 = std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::empty
                    (&this->reachable);
  if (bVar1) {
    bVar1 = end(this);
    if (bVar1) {
      std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::insert
                (&this->reachable,&this->rule);
    }
    else if (this->loop < 2) {
      local_increment_t<unsigned_char>::local_increment_t
                ((local_increment_t<unsigned_char> *)&i,&this->loop);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::begin(&this->arcs);
      while( true ) {
        local_38._M_node =
             (_Base_ptr)
             std::
             map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::end(&this->arcs);
        bVar1 = std::operator!=(&local_30,&local_38);
        if (!bVar1) break;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_30);
        calc_reachable(ppVar2->first);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_30);
        __first = std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::
                  begin(&ppVar2->first->reachable);
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_30);
        __last = std::set<re2c::rule_t,_std::less<re2c::rule_t>,_std::allocator<re2c::rule_t>_>::end
                           (&ppVar2->first->reachable);
        std::set<re2c::rule_t,std::less<re2c::rule_t>,std::allocator<re2c::rule_t>>::
        insert<std::_Rb_tree_const_iterator<re2c::rule_t>>
                  ((set<re2c::rule_t,std::less<re2c::rule_t>,std::allocator<re2c::rule_t>> *)
                   &this->reachable,(_Rb_tree_const_iterator<re2c::rule_t>)__first._M_node,
                   (_Rb_tree_const_iterator<re2c::rule_t>)__last._M_node);
        std::
        _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++(&local_30);
      }
      local_increment_t<unsigned_char>::~local_increment_t((local_increment_t<unsigned_char> *)&i);
    }
  }
  return;
}

Assistant:

void Node::calc_reachable ()
{
	if (!reachable.empty ())
	{
		return;
	}
	else if (end ())
	{
		reachable.insert (rule);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin (); i != arcs.end (); ++i)
		{
			i->first->calc_reachable ();
			reachable.insert (i->first->reachable.begin (), i->first->reachable.end ());
		}
	}
}